

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<void(int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long)>::
Action<ProcessFileNameFreeBSD_LengthIncreasesOnEachIteration_Test::TestBody()::__0_const&,void>
          (Action<void(int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long)>
           *this,anon_class_8_1_8713552d_for__M_head_impl *fun)

{
  _Any_data __tmp;
  _Any_data local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)this = fun->lengths;
  *(undefined8 *)(this + 8) = 0;
  local_18 = 0;
  *(code **)(this + 0x10) =
       std::
       _Function_handler<void_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp:216:26)>
       ::_M_manager;
  local_10 = 0;
  *(code **)(this + 0x18) =
       std::
       _Function_handler<void_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp:216:26)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

Action(G&& fun) {  // NOLINT
    Init(::std::forward<G>(fun), IsCompatibleFunctor<G>());
  }